

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSC.cpp
# Opt level: O2

void __thiscall CSC::Triplet(CSC *this)

{
  long lVar1;
  ostream *poVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"CSC:");
  std::operator<<(poVar2,"\n");
  lVar1 = 0;
  while (lVar4 = lVar1, lVar4 < this->col) {
    piVar3 = this->ptr;
    for (lVar5 = (long)piVar3[lVar4]; lVar1 = lVar4 + 1, lVar5 < piVar3[lVar4 + 1];
        lVar5 = lVar5 + 1) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->idx[lVar5]);
      std::operator<<(poVar2,"\t");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar4);
      std::operator<<(poVar2,"\t");
      poVar2 = std::ostream::_M_insert<double>(this->val[lVar5]);
      std::operator<<(poVar2,"\n");
      piVar3 = this->ptr;
    }
  }
  return;
}

Assistant:

void CSC::Triplet()
{
    cout<<"CSC:"<<"\n";
   for(int i=0; i<col; i++)
   {
       for(int j=ptr[i]; j<ptr[i+1]; j++)
       {
           std::cout << idx[j] << "\t"; // row
           std::cout << i << "\t";     //column
           std::cout << val[j] << "\n"; //value
       }
   }
}